

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Node * __thiscall parser::Parser::parse(Node *__return_storage_ptr__,Parser *this,Tokens *tokens)

{
  pointer pAVar1;
  pointer pcVar2;
  int iVar3;
  Node *pNVar4;
  int iVar5;
  int iVar6;
  pointer pNVar7;
  State SVar8;
  vector<parser::ActionState,_std::allocator<parser::ActionState>_> *pvVar9;
  ostream *poVar10;
  runtime_error *prVar11;
  iterator __first;
  ulong uVar12;
  pointer nextToken;
  iterator __x;
  StateStack stateStack;
  ActionState actionState;
  Nodes nodeStack;
  Nodes nodes;
  StateStack local_138;
  ActionState local_118;
  Nodes *local_f8 [2];
  Nodes local_e8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  vector<parser::Node,_std::allocator<parser::Node>_> local_98;
  Node *local_78;
  Tokens *local_70;
  vector<parser::Node,_std::allocator<parser::Node>_> local_68;
  Production local_50;
  
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78 = __return_storage_ptr__;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_138,(iterator)0x0,&StartNonTerminal);
  local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (Node *)0x0;
  local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nextToken = (tokens->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_70 = tokens;
  while( true ) {
    pvVar9 = getAction(this,local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish[-1],nextToken->tokenId);
    pNVar4 = local_78;
    pNVar7 = local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pAVar1 = (pvVar9->super__Vector_base<parser::ActionState,_std::allocator<parser::ActionState>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    if (pAVar1 == (pvVar9->
                  super__Vector_base<parser::ActionState,_std::allocator<parser::ActionState>_>).
                  _M_impl.super__Vector_impl_data._M_finish) break;
    local_118.action = pAVar1->action;
    local_118.state = pAVar1->state;
    local_118.nonTerminal = pAVar1->nonTerminal;
    local_118._12_4_ = *(undefined4 *)&pAVar1->field_0xc;
    local_118.reduceCount = pAVar1->reduceCount;
    switch(pAVar1->action) {
    case Shift:
      Node::Node((Node *)local_f8,nextToken);
      std::vector<parser::Node,_std::allocator<parser::Node>_>::emplace_back<parser::Node>
                (&local_98,(Node *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((Node *)local_f8)->token + 0x18U)) {
        operator_delete(local_c8._M_p,local_b8[0]._M_allocated_capacity + 1);
      }
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector
                ((Nodes *)((long)&((Node *)local_f8)->production + 8));
      if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_138,
                   (iterator)
                   local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_118.state);
      }
      else {
        *local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_118.state;
        local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (this->debug == true) {
        poVar10 = stringifyStep(this,(ostream *)&std::cout,&local_138,&local_98,&local_118,nextToken
                               );
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      nextToken = nextToken + 1;
      if (nextToken ==
          (tokens->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_f8[0] = (Nodes *)((long)&((Node *)local_f8)->production + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"error state","");
        std::runtime_error::runtime_error(prVar11,(string *)local_f8);
        *(undefined ***)prVar11 = &PTR__runtime_error_00128bd8;
        __cxa_throw(prVar11,&ParserError::typeinfo,std::runtime_error::~runtime_error);
      }
      break;
    case Reduce:
      local_68.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __first._M_current =
           local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
           super__Vector_impl_data._M_finish + -local_118.reduceCount;
      if (0 < (long)(local_118.reduceCount * 0x60)) {
        uVar12 = (local_118.reduceCount * 0x60) / 0x60 + 1;
        __x._M_current = __first._M_current;
        do {
          std::vector<parser::Node,_std::allocator<parser::Node>_>::push_back
                    (&local_68,__x._M_current);
          __x._M_current = __x._M_current + 1;
          uVar12 = uVar12 - 1;
          tokens = local_70;
        } while (1 < uVar12);
      }
      std::vector<parser::Node,_std::allocator<parser::Node>_>::_M_erase
                (&local_98,__first,
                 (iterator)
                 local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      local_50.nonTerminal = local_118.nonTerminal;
      std::vector<parser::Node,_std::allocator<parser::Node>_>::vector(&local_50.nodes,&local_68);
      Node::Node((Node *)local_f8,&local_50);
      std::vector<parser::Node,_std::allocator<parser::Node>_>::emplace_back<parser::Node>
                (&local_98,(Node *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((Node *)local_f8)->token + 0x18U)) {
        operator_delete(local_c8._M_p,local_b8[0]._M_allocated_capacity + 1);
      }
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector
                ((Nodes *)((long)&((Node *)local_f8)->production + 8));
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector(&local_50.nodes);
      if (local_118.reduceCount != 0) {
        local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -local_118.reduceCount;
      }
      SVar8 = goTo(this,local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1],local_118.nonTerminal);
      local_f8[0] = (Nodes *)CONCAT44(local_f8[0]._4_4_,SVar8);
      if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_138,
                   (iterator)
                   local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_f8);
      }
      else {
        *local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = SVar8;
        local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (this->debug == true) {
        poVar10 = stringifyStep(this,(ostream *)&std::cout,&local_138,&local_98,&local_118,nextToken
                               );
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector(&local_68);
      break;
    case Accept:
      if ((long)local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                super__Vector_impl_data._M_start != 0x60) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_f8[0] = (Nodes *)((long)&((Node *)local_f8)->production + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,"work done but, stack contains more than one element","");
        std::runtime_error::runtime_error(prVar11,(string *)local_f8);
        *(undefined ***)prVar11 = &PTR__runtime_error_00128bd8;
        __cxa_throw(prVar11,&ParserError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_78->isProduction_ =
           local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].isProduction_;
      (local_78->production).nonTerminal =
           local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].production.nonTerminal;
      std::vector<parser::Node,_std::allocator<parser::Node>_>::vector
                (&(local_78->production).nodes,
                 &local_98.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].production.nodes);
      (pNVar4->token).tokenId = pNVar7[-1].token.tokenId;
      (pNVar4->token).value._M_dataplus._M_p = (pointer)&(pNVar4->token).value.field_2;
      pcVar2 = pNVar7[-1].token.value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(pNVar4->token).value,pcVar2,
                 pcVar2 + pNVar7[-1].token.value._M_string_length);
      iVar3 = pNVar7[-1].token.endLine;
      iVar5 = pNVar7[-1].token.startSymbol;
      iVar6 = pNVar7[-1].token.endSymbol;
      (pNVar4->token).startLine = pNVar7[-1].token.startLine;
      (pNVar4->token).endLine = iVar3;
      (pNVar4->token).startSymbol = iVar5;
      (pNVar4->token).endSymbol = iVar6;
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector(&local_98);
      if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return pNVar4;
    case Error:
switchD_00119a5e_caseD_3:
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_f8[0] = (Nodes *)((long)&((Node *)local_f8)->production + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"error state","");
      std::runtime_error::runtime_error(prVar11,(string *)local_f8);
      *(undefined ***)prVar11 = &PTR__runtime_error_00128bd8;
      __cxa_throw(prVar11,&ParserError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_118.action = Error;
  local_118.state = 0;
  local_118.nonTerminal = 0;
  local_118.reduceCount = 0;
  goto switchD_00119a5e_caseD_3;
}

Assistant:

Node parse(lexer::Tokens const& tokens) {
            StateStack stateStack;
            stateStack.push_back(StartNonTerminal);
            Nodes nodeStack;
            Tokens::const_iterator token = tokens.begin();
            while (true) {
                ActionState actionState = action(stateStack.back(), token->tokenId);
                if (actionState.action == Shift) {
                    nodeStack.push_back(Node(*token));
                    stateStack.push_back(actionState.state);
                    if (debug)
                        stringifyStep(std::cout, stateStack, nodeStack, actionState, *token) << std::endl;
                    ++token;
					if (token == tokens.end()) {
						throw ParserError("error state");
					}
                } else if (actionState.action == Reduce) {
                    Nodes nodes;
                    Nodes::iterator start = nodeStack.end() - actionState.reduceCount;
                    std::copy(start,
                              nodeStack.end(),
                              std::back_inserter(nodes));

                    nodeStack.erase(start, nodeStack.end());
                    nodeStack.push_back(Node(Production(actionState.nonTerminal, nodes)));

                    stateStack.erase(stateStack.end() - actionState.reduceCount, stateStack.end());
                    stateStack.push_back(goTo(stateStack.back(), actionState.nonTerminal));

                    if (debug)
                        stringifyStep(std::cout, stateStack, nodeStack, actionState, *token) << std::endl;
                } else if (actionState.action == Error) {
                    throw ParserError("error state");
                } else if (actionState.action == Accept) {
                    return nodeStack.size() == 1
                           ? nodeStack.back()
                           : throw ParserError("work done but, stack contains more than one element");
                }
            }
        }